

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpData.cc
# Opt level: O2

void __thiscall tt::net::HttpData::handleError(HttpData *this,int fd,int err_num,string *short_msg)

{
  size_t sVar1;
  undefined1 local_10e8 [8];
  char send_buff [4096];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  size_type *local_a8;
  string body_buff;
  string header_buff;
  string local_48;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10e8," "
                 ,short_msg);
  std::__cxx11::string::operator=((string *)short_msg,(string *)local_10e8);
  std::__cxx11::string::~string((string *)local_10e8);
  local_a8 = &body_buff._M_string_length;
  body_buff._M_dataplus._M_p = (pointer)0x0;
  body_buff._M_string_length._0_1_ = 0;
  body_buff.field_2._8_8_ = &header_buff._M_string_length;
  header_buff._M_dataplus._M_p = (pointer)0x0;
  header_buff._M_string_length._0_1_ = 0;
  std::__cxx11::string::append((char *)&local_a8);
  std::__cxx11::string::append((char *)&local_a8);
  std::__cxx11::to_string(&local_48,err_num);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&header_buff.field_2 + 8),&local_48,short_msg);
  std::__cxx11::string::append((string *)&local_a8);
  std::__cxx11::string::~string((string *)(header_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::append((char *)&local_a8);
  std::__cxx11::to_string((string *)(send_buff + 0xff8),err_num);
  std::operator+(&local_c8,"HTTP/1.1 ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (send_buff + 0xff8));
  std::operator+(&local_48,&local_c8,short_msg);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&header_buff.field_2 + 8),&local_48,"\r\n");
  std::__cxx11::string::append((string *)(body_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(header_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)(send_buff + 0xff8));
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  std::__cxx11::to_string(&local_c8,(unsigned_long)body_buff._M_dataplus._M_p);
  std::operator+(&local_48,"Content-Length: ",&local_c8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&header_buff.field_2 + 8),&local_48,"\r\n");
  std::__cxx11::string::append((string *)(body_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(header_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  std::__cxx11::string::append(body_buff.field_2._M_local_buf + 8);
  strcpy(local_10e8,(char *)body_buff.field_2._8_8_);
  sVar1 = strlen(local_10e8);
  writen(fd,local_10e8,sVar1);
  strcpy(local_10e8,(char *)local_a8);
  sVar1 = strlen(local_10e8);
  writen(fd,local_10e8,sVar1);
  std::__cxx11::string::~string((string *)(body_buff.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_a8);
  return;
}

Assistant:

void HttpData::handleError(int fd, int err_num, std::string short_msg) {
  short_msg = " " + short_msg;
  char send_buff[4096];
  std::string body_buff, header_buff;
  body_buff += "<html><title>哎~出错了</title>";
  body_buff += "<body bgcolor=\"ffffff\">";
  body_buff += std::to_string(err_num) + short_msg;
  body_buff += "<hr><em> LinYa's Web Server</em>\n</body></html>";

  header_buff += "HTTP/1.1 " + std::to_string(err_num) + short_msg + "\r\n";
  header_buff += "Content-Type: text/html\r\n";
  header_buff += "Connection: Close\r\n";
  header_buff += "Content-Length: " + std::to_string(body_buff.size()) + "\r\n";
  header_buff += "Server: LinYa's Web Server\r\n";
  ;
  header_buff += "\r\n";
  // 错误处理不考虑writen不完的情况
  sprintf(send_buff, "%s", header_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
  sprintf(send_buff, "%s", body_buff.c_str());
  writen(fd, send_buff, strlen(send_buff));
}